

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O3

void __thiscall
TasGrid::TasmanianSparseGrid::evaluateHierarchicalFunctions
          (TasmanianSparseGrid *this,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *y)

{
  int iVar1;
  BaseCanonicalGrid *pBVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  MultiIndexSet *pMVar5;
  int iVar6;
  runtime_error *this_00;
  
  pBVar2 = (this->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar2 != (BaseCanonicalGrid *)0x0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)pBVar2->num_dimensions;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3;
    pMVar5 = &pBVar2->points;
    if (*(pointer *)&(pBVar2->points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl
        == (pBVar2->points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      pMVar5 = &pBVar2->needed;
    }
    iVar1 = *(int *)((long)pMVar5 + 8);
    iVar6 = (*pBVar2->_vptr_BaseCanonicalGrid[6])();
    ::std::vector<double,_std::allocator<double>_>::resize
              (y,(long)iVar1 * SUB168(auVar4 / auVar3,0) << ((byte)iVar6 & 0x3f));
    evaluateHierarchicalFunctions
              (this,(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start,SUB164(auVar4 / auVar3,0),
               (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error
            (this_00,"ERROR: cannot call evaluateHierarchicalFunctions() on an empty grid");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TasmanianSparseGrid::evaluateHierarchicalFunctions(const std::vector<double> &x, std::vector<double> &y) const{
    if (empty()) throw std::runtime_error("ERROR: cannot call evaluateHierarchicalFunctions() on an empty grid");
    int num_points = getNumPoints();
    size_t num_x = x.size() / getNumDimensions();
    size_t expected_size = num_points * num_x * (isFourier() ? 2 : 1);
    y.resize(expected_size);
    evaluateHierarchicalFunctions(x.data(), (int) num_x, y.data());
}